

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O0

void __thiscall
hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(ValueKnowledge *this,int value)

{
  size_type sVar1;
  int in_ESI;
  int *in_RDI;
  bool bVar2;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffd8;
  bool bVar3;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  
  bVar3 = false;
  if (-1 < in_ESI) {
    sVar1 = std::vector<bool,_std::allocator<bool>_>::size(unaff_retaddr);
    bVar3 = (ulong)(long)in_ESI < sVar1;
  }
  if (bVar3 == false) {
    __assert_fail("value >= 0 && value < value_plausible_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                  ,0x27,
                  "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int)");
  }
  bVar2 = true;
  if (-1 < *in_RDI) {
    bVar2 = *in_RDI != in_ESI;
  }
  if (!bVar2) {
    __assert_fail("value_ < 0 || value_ != value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_hand.cc"
                  ,0x28,
                  "void hanabi_learning_env::HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int)");
  }
  std::vector<bool,_std::allocator<bool>_>::operator[]
            (in_stack_ffffffffffffffe0,CONCAT17(bVar3,in_stack_ffffffffffffffd8));
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffe0,false);
  return;
}

Assistant:

void HanabiHand::ValueKnowledge::ApplyIsNotValueHint(int value) {
  assert(value >= 0 && value < value_plausible_.size());
  assert(value_ < 0 || value_ != value);
  value_plausible_[value] = false;
}